

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O0

void ncnn::nms_sorted_bboxes
               (vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *bboxes,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *picked,float nms_threshold)

{
  bool bVar1;
  const_reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  Rect *in_RDI;
  float in_XMM0_Da;
  float fVar6;
  float union_area;
  float inter_area;
  Rect *b;
  size_t j;
  int keep;
  Rect *a;
  size_t i_1;
  float height;
  float width;
  Rect *r;
  size_t i;
  vector<float,_std::allocator<float>_> areas;
  size_t n;
  undefined4 in_stack_ffffffffffffff30;
  value_type in_stack_ffffffffffffff34;
  Rect *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  size_type in_stack_ffffffffffffff48;
  size_type sVar7;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  size_type local_88;
  ulong local_70;
  size_type local_58;
  vector<float,_std::allocator<float>_> local_38;
  size_type local_20;
  float local_14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  Rect *local_8;
  
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd661fd);
  local_20 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::size
                       ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)local_8);
  std::allocator<float>::allocator((allocator<float> *)0xd66231);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
             ,(allocator_type *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  std::allocator<float>::~allocator((allocator<float> *)0xd66257);
  for (local_58 = 0; local_58 < local_20; local_58 = local_58 + 1) {
    pvVar2 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
                       ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)local_8,local_58);
    fVar6 = (pvVar2->x2 - pvVar2->x1) * (pvVar2->y2 - pvVar2->y1);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,local_58);
    *pvVar3 = fVar6;
  }
  for (local_70 = 0; local_70 < local_20; local_70 = local_70 + 1) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
              ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)local_8,local_70);
    bVar1 = true;
    local_88 = 0;
    while( true ) {
      sVar7 = local_88;
      sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
      if (sVar4 <= sVar7) break;
      in_stack_ffffffffffffff38 = local_8;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_10,local_88);
      std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
                ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_ffffffffffffff38,
                 *pvVar5);
      fVar6 = intersection_area(in_stack_ffffffffffffff38,
                                (Rect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ));
      in_stack_ffffffffffffff44 = fVar6;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,local_70);
      in_stack_ffffffffffffff34 = *pvVar3;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_10,local_88);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,*pvVar5);
      if (local_14 < fVar6 / ((in_stack_ffffffffffffff34 + *pvVar3) - fVar6)) {
        bVar1 = false;
      }
      local_88 = local_88 + 1;
    }
    if (bVar1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (value_type_conflict5 *)in_stack_ffffffffffffff38);
    }
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  return;
}

Assistant:

static void nms_sorted_bboxes(const std::vector<Rect>& bboxes, std::vector<size_t>& picked, float nms_threshold)
{
    picked.clear();

    const size_t n = bboxes.size();

    std::vector<float> areas(n);
    for (size_t i = 0; i < n; i++)
    {
        const Rect& r = bboxes[i];

        float width = r.x2 - r.x1;
        float height = r.y2 - r.y1;

        areas[i] = width * height;
    }

    for (size_t i = 0; i < n; i++)
    {
        const Rect& a = bboxes[i];

        int keep = 1;
        for (size_t j = 0; j < picked.size(); j++)
        {
            const Rect& b = bboxes[picked[j]];

            // intersection over union
            float inter_area = intersection_area(a, b);
            float union_area = areas[i] + areas[picked[j]] - inter_area;
            //             float IoU = inter_area / union_area
            if (inter_area / union_area > nms_threshold)
                keep = 0;
        }

        if (keep)
            picked.push_back(i);
    }
}